

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O3

void tb(void)

{
  int iVar1;
  int iVar2;
  char buf [128];
  char local_b8;
  undefined4 uStack_b7;
  undefined3 uStack_b3;
  int local_b0;
  undefined1 uStack_ac;
  
  printf("SMBus / I2C tests.");
  iVar1 = i2c_open(1,0x53,0);
  CHECK(0xb,1,iVar1,0,0,"i2c open");
  iVar2 = i2c_write_device(iVar1,"",1);
  CHECK(0xb,2,iVar2,0,0,"i2c write device");
  iVar2 = i2c_read_device(iVar1,&local_b8,1);
  CHECK(0xb,3,iVar2,1,0,"i2c read device");
  CHECK(0xb,4,(int)local_b8,0xe5,0,"i2c read device");
  iVar2 = i2c_read_byte(iVar1);
  CHECK(0xb,5,iVar2,0xe5,0,"i2c read byte");
  iVar2 = i2c_read_byte_data(iVar1,0);
  CHECK(0xb,6,iVar2,0xe5,0,"i2c read byte data");
  iVar2 = i2c_read_byte_data(iVar1,0x30);
  CHECK(0xb,7,iVar2,2,0,"i2c read byte data");
  iVar2 = i2c_write_device(iVar1,"\x1d[aBcDeFgHjKM]",0xe);
  CHECK(0xb,8,iVar2,0,0,"i2c write device");
  i2c_write_device(iVar1,"\x1d",1);
  iVar2 = i2c_read_device(iVar1,&local_b8,0xd);
  CHECK(0xb,9,iVar2,0xd,0,"i2c read device");
  iVar2 = strncmp(&local_b8,"[aBcDeFgHjKM]",0xd);
  CHECK(0xb,10,iVar2,0,0,"i2c read device");
  if (CONCAT17(uStack_ac,CONCAT43(local_b0,uStack_b3)) != 0x5d4d4b6a48674665 ||
      CONCAT35(uStack_b3,CONCAT41(uStack_b7,local_b8)) != 0x674665446342615b) {
    printf("got [%.*s] expected [%.*s]\n",0xd,&local_b8);
  }
  iVar2 = i2c_write_byte_data(iVar1,0x1d,0xaa);
  CHECK(0xb,0xb,iVar2,0,0,"i2c write byte data");
  iVar2 = i2c_read_byte_data(iVar1,0x1d);
  CHECK(0xb,0xc,iVar2,0xaa,0,"i2c read byte data");
  iVar2 = i2c_write_byte_data(iVar1,0x1d,0x55);
  CHECK(0xb,0xd,iVar2,0,0,"i2c write byte data");
  iVar2 = i2c_read_byte_data(iVar1,0x1d);
  CHECK(0xb,0xe,iVar2,0x55,0,"i2c read byte data");
  iVar2 = i2c_write_block_data(iVar1,0x1c,"[1234567890#]");
  CHECK(0xb,0xf,iVar2,0,0,"i2c write block data");
  i2c_write_device(iVar1,"\x1d",1);
  iVar2 = i2c_read_device(iVar1,&local_b8,0xd);
  CHECK(0xb,0x10,iVar2,0xd,0,"i2c read device");
  iVar2 = strncmp(&local_b8,"[1234567890#]",0xd);
  CHECK(0xb,0x11,iVar2,0,0,"i2c read device");
  if (CONCAT17(uStack_ac,CONCAT43(local_b0,uStack_b3)) != 0x5d23303938373635 ||
      CONCAT35(uStack_b3,CONCAT41(uStack_b7,local_b8)) != 0x373635343332315b) {
    printf("got [%.*s] expected [%.*s]\n",0xd,&local_b8,0xd);
  }
  iVar2 = i2c_read_i2c_block_data(iVar1,0x1d,&local_b8,0xd);
  CHECK(0xb,0x12,iVar2,0xd,0,"i2c read i2c block data");
  iVar2 = strncmp(&local_b8,"[1234567890#]",0xd);
  CHECK(0xb,0x13,iVar2,0,0,"i2c read i2c block data");
  if (CONCAT17(uStack_ac,CONCAT43(local_b0,uStack_b3)) != 0x5d23303938373635 ||
      CONCAT35(uStack_b3,CONCAT41(uStack_b7,local_b8)) != 0x373635343332315b) {
    printf("got [%.*s] expected [%.*s]\n",0xd,&local_b8,0xd);
  }
  iVar2 = i2c_write_i2c_block_data(iVar1,0x1d,"(-+=;:,<>!%)");
  CHECK(0xb,0x14,iVar2,0,0,"i2c write i2c block data");
  iVar2 = i2c_read_i2c_block_data(iVar1,0x1d,&local_b8,0xc);
  CHECK(0xb,0x15,iVar2,0xc,0,"i2c read i2c block data");
  iVar2 = strncmp(&local_b8,"(-+=;:,<>!%)",0xc);
  CHECK(0xb,0x16,iVar2,0,0,"i2c read i2c block data");
  if (local_b0 != 0x2925213e ||
      CONCAT35(uStack_b3,CONCAT41(uStack_b7,local_b8)) != 0x3c2c3a3b3d2b2d28) {
    printf("got [%.*s] expected [%.*s]\n",0xc,&local_b8);
  }
  iVar1 = i2c_close(iVar1);
  CHECK(0xb,0x17,iVar1,0,0,"i2c close");
  return;
}

Assistant:

void tb()
{
   int h, e, b, len;
   char *exp;
   char buf[128];

   printf("SMBus / I2C tests.");

   /* this test requires an ADXL345 on I2C bus 1 addr 0x53 */

   h = i2c_open(1, 0x53, 0);
   CHECK(11, 1, h, 0, 0, "i2c open");

   e = i2c_write_device(h, "\x00", 1); /* move to known register */
   CHECK(11, 2, e, 0, 0, "i2c write device");

   b = i2c_read_device(h, buf, 1);
   CHECK(11, 3, b, 1, 0, "i2c read device");
   CHECK(11, 4, buf[0], 0xE5, 0, "i2c read device");

   b = i2c_read_byte(h);
   CHECK(11, 5, b, 0xE5, 0, "i2c read byte");

   b = i2c_read_byte_data(h, 0);
   CHECK(11, 6, b, 0xE5, 0, "i2c read byte data");

   b = i2c_read_byte_data(h, 48);
   CHECK(11, 7, b, 2, 0, "i2c read byte data");

   exp = "\x1D[aBcDeFgHjKM]";
   len = strlen(exp);

   e = i2c_write_device(h, exp, len);
   CHECK(11, 8, e, 0, 0, "i2c write device");

   e = i2c_write_device(h, "\x1D", 1);
   b = i2c_read_device(h, buf, len-1);
   CHECK(11, 9, b, len-1, 0, "i2c read device");
   CHECK(11, 10, strncmp(buf, exp+1, len-1), 0, 0, "i2c read device");

   if (strncmp(buf, exp+1, len-1))
      printf("got [%.*s] expected [%.*s]\n", len-1, buf, len-1, exp+1);

   e = i2c_write_byte_data(h, 0x1d, 0xAA);
   CHECK(11, 11, e, 0, 0, "i2c write byte data");

   b = i2c_read_byte_data(h, 0x1d);
   CHECK(11, 12, b, 0xAA, 0, "i2c read byte data");

   e = i2c_write_byte_data(h, 0x1d, 0x55);
   CHECK(11, 13, e, 0, 0, "i2c write byte data");

   b = i2c_read_byte_data(h, 0x1d);
   CHECK(11, 14, b, 0x55, 0, "i2c read byte data");

   exp = "[1234567890#]";
   len = strlen(exp);

   e = i2c_write_block_data(h, 0x1C, exp, len);
   CHECK(11, 15, e, 0, 0, "i2c write block data");

   e = i2c_write_device(h, "\x1D", 1);
   b = i2c_read_device(h, buf, len);
   CHECK(11, 16, b, len, 0, "i2c read device");
   CHECK(11, 17, strncmp(buf, exp, len), 0, 0, "i2c read device");

   if (strncmp(buf, exp, len))
      printf("got [%.*s] expected [%.*s]\n", len, buf, len, exp);

   b = i2c_read_i2c_block_data(h, 0x1D, buf, len);
   CHECK(11, 18, b, len, 0, "i2c read i2c block data");
   CHECK(11, 19, strncmp(buf, exp, len), 0, 0, "i2c read i2c block data");

   if (strncmp(buf, exp, len))
      printf("got [%.*s] expected [%.*s]\n", len, buf, len, exp);

   exp = "(-+=;:,<>!%)";
   len = strlen(exp);

   e = i2c_write_i2c_block_data(h, 0x1D, exp, len);
   CHECK(11, 20, e, 0, 0, "i2c write i2c block data");

   b = i2c_read_i2c_block_data(h, 0x1D, buf, len);
   CHECK(11, 21, b, len, 0, "i2c read i2c block data");
   CHECK(11, 22, strncmp(buf, exp, len), 0, 0, "i2c read i2c block data");

   if (strncmp(buf, exp, len))
      printf("got [%.*s] expected [%.*s]\n", len, buf, len, exp);

   e = i2c_close(h);
   CHECK(11, 23, e, 0, 0, "i2c close");
}